

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demand_queue.hpp
# Opt level: O1

void __thiscall
so_5::disp::prio_one_thread::quoted_round_robin::impl::demand_queue_t::~demand_queue_t
          (demand_queue_t *this)

{
  demand_t *pdVar1;
  _Head_base<0UL,_so_5::disp::mpsc_queue_traits::lock_t_*,_false> _Var2;
  demand_t *pdVar3;
  demand_t *in_RAX;
  pointer *__ptr_1;
  pointer *__ptr;
  long lVar4;
  demand_t *local_28;
  
  lVar4 = 0x18;
  local_28 = in_RAX;
  do {
    pdVar1 = *(demand_t **)((long)this->m_priorities + lVar4 + -8);
    pdVar3 = local_28;
    while (local_28 = pdVar1, local_28 != (demand_t *)0x0) {
      pdVar1 = local_28->m_next;
      std::default_delete<so_5::disp::prio_one_thread::quoted_round_robin::impl::demand_t>::
      operator()((default_delete<so_5::disp::prio_one_thread::quoted_round_robin::impl::demand_t> *)
                 &local_28,local_28);
      pdVar3 = local_28;
    }
    lVar4 = lVar4 + 0x40;
    local_28 = pdVar3;
  } while (lVar4 != 0x218);
  lVar4 = 0x1d8;
  do {
    event_queue_t::~event_queue_t((event_queue_t *)((long)this->m_priorities + lVar4 + -0x18));
    lVar4 = lVar4 + -0x40;
  } while (lVar4 != -0x28);
  _Var2._M_head_impl =
       (this->m_lock)._M_t.
       super___uniq_ptr_impl<so_5::disp::mpsc_queue_traits::lock_t,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>
       ._M_t.
       super__Tuple_impl<0UL,_so_5::disp::mpsc_queue_traits::lock_t_*,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>
       .super__Head_base<0UL,_so_5::disp::mpsc_queue_traits::lock_t_*,_false>._M_head_impl;
  if (_Var2._M_head_impl != (lock_t *)0x0) {
    (*(_Var2._M_head_impl)->_vptr_lock_t[1])();
  }
  (this->m_lock)._M_t.
  super___uniq_ptr_impl<so_5::disp::mpsc_queue_traits::lock_t,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>
  ._M_t.
  super__Tuple_impl<0UL,_so_5::disp::mpsc_queue_traits::lock_t_*,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>
  .super__Head_base<0UL,_so_5::disp::mpsc_queue_traits::lock_t_*,_false>._M_head_impl =
       (lock_t *)0x0;
  return;
}

Assistant:

~demand_queue_t()
			{
				for( auto & q : m_priorities )
					cleanup_queue( q );
			}